

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void INT_REVstone_add_split_target(CMConnection conn,EVstone stone,EVstone target_stone)

{
  int iVar1;
  CManager cm;
  int in_EDX;
  int in_ESI;
  CManager in_RDI;
  EVstone_add_split_target_request request;
  CMFormat f;
  int cond;
  CMFormat in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CManager in_stack_ffffffffffffffe0;
  
  memset(&stack0xffffffffffffffd4,0,0xc);
  iVar1 = INT_CMCondition_get(in_stack_ffffffffffffffe0,
                              (CMConnection)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  cm = (CManager)
       INT_CMlookup_format((CManager)in_RDI->transports,EVstone_add_split_target_req_formats);
  if (cm == (CManager)0x0) {
    cm = (CManager)
         INT_CMregister_format
                   ((CManager)CONCAT44(in_EDX,in_ESI),
                    (FMStructDescList)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  }
  INT_CMCondition_set_client_data(cm,in_EDX,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  INT_CMwrite((CMConnection)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
              (void *)0x1565c3);
  INT_CMCondition_wait(in_RDI,in_ESI);
  return;
}

Assistant:

extern void
INT_REVstone_add_split_target(CMConnection conn, EVstone stone, EVstone target_stone)
{
    int cond;
    CMFormat f;
    EVstone_add_split_target_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVstone_add_split_target_req_formats);
    request.stone = stone;
    request.target_stone = target_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVstone_add_split_target_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}